

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O0

Name wasm::Name::fromInt(size_t i)

{
  char *__str;
  string local_60;
  string_view local_40;
  string_view local_30;
  size_t local_20;
  size_t i_local;
  
  local_20 = i;
  std::__cxx11::to_string(&local_60,i);
  __str = (char *)std::__cxx11::string::c_str();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,__str);
  IString::IString((IString *)&local_30,local_40,false);
  Name((Name *)&i_local,(IString)local_30);
  std::__cxx11::string::~string((string *)&local_60);
  return (IString)(IString)_i_local;
}

Assistant:

static Name fromInt(size_t i) {
    return IString(std::to_string(i).c_str(), false);
  }